

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O1

void __thiscall
ShellLinkAndJumpListHandler::parseLNKStruct
          (ShellLinkAndJumpListHandler *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *headerValue)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  long *plVar5;
  uint uVar6;
  ShellLink shellLink;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  int local_38;
  bool bStack_34;
  undefined3 uStack_33;
  long local_28;
  
  ReadStream::read((ReadStream *)&stack0xffffffffffffffc8,(int)this->rs,
                   (void *)(ulong)(this->startPosition + 4),4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (headerValue,(ReadStream *)&stack0xffffffffffffffc8);
  if (_local_38 != (ShellLink)0x0) {
    operator_delete((void *)_local_38,local_28 - (long)_local_38);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_50,headerValue);
  iVar2 = Utils::lenFourBytesChar(&local_50);
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (iVar2 == 0x1140200) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[ShellLink structure ",0x15);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->countOfShellLink + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]: ",3);
    local_38 = 0;
    bStack_34 = false;
    uStack_33 = 0;
    ShellLink::parseShellLinkStructure
              ((ShellLink *)&stack0xffffffffffffffc8,this->rs,this->startPosition);
    uVar3 = ShellLink::getShellLinkOffsetEnd((ShellLink *)&stack0xffffffffffffffc8);
    uVar6 = uVar3 + 0xf;
    if (-1 < (int)uVar3) {
      uVar6 = uVar3;
    }
    iVar2 = (uVar6 & 0xfffffff0) + 0xc;
    if (uVar3 == (uVar6 & 0xfffffff0)) {
      iVar2 = uVar3 - 4;
    }
    this->startPosition = iVar2;
    this->countOfShellLink = this->countOfShellLink + 1;
    bVar1 = ShellLink::isThisShellLinkHasErrors((ShellLink *)&stack0xffffffffffffffc8);
    if (bVar1) {
      this->countOfShellLinkWithErrors = this->countOfShellLinkWithErrors + 1;
    }
    ShellLink::resetAllFlags((ShellLink *)&stack0xffffffffffffffc8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    plVar5 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    plVar5 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
  }
  else {
    this->startPosition = this->startPosition + 4;
  }
  return;
}

Assistant:

void ShellLinkAndJumpListHandler::parseLNKStruct(std::vector<unsigned char> headerValue) {
    /* Decode ShellLink Stream = CustDest Jump List */
    headerValue =  rs->read(startPosition + 4,4);
    if (Utils::lenFourBytesChar(headerValue) != 0x01140200) { // Если следующее поле не CLSID -> ищем структуры далее
        startPosition += 4;
        return;
    }
    cout << "[ShellLink structure " << dec << countOfShellLink + 1 << "]: ";
    ShellLink shellLink = ShellLink();
    shellLink.parseShellLinkStructure(rs, startPosition);
    int offsetEnd = shellLink.getShellLinkOffsetEnd();
    int remainder = offsetEnd % 16;
    startPosition = remainder == 0 ? offsetEnd - 4 : offsetEnd + 12 - remainder;  // так как в while будет + 4
    ++countOfShellLink;
    if(shellLink.isThisShellLinkHasErrors())
        ++countOfShellLinkWithErrors;
    shellLink.resetAllFlags();
    cout << endl << endl << endl;
    return;
}